

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O2

void Js::AsmJsByteCodeDumper::
     DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ByteCodeDumper::DumpReg(data->R0);
  ByteCodeDumper::DumpReg(data->R1);
  ByteCodeDumper::DumpReg(data->R2);
  ByteCodeDumper::DumpReg(data->R3);
  ByteCodeDumper::DumpReg(data->R4);
  ByteCodeDumper::DumpReg(data->R5);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmReg6(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpReg(data->R0);
        DumpReg(data->R1);
        DumpReg(data->R2);
        DumpReg(data->R3);
        DumpReg(data->R4);
        DumpReg(data->R5);
    }